

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLBINDSAMPLERSPROC epoxy_glBindSamplers_resolver(void)

{
  PFNGLBINDSAMPLERSPROC p_Var1;
  
  p_Var1 = (PFNGLBINDSAMPLERSPROC)
           gl_provider_resolver
                     ("glBindSamplers",epoxy_glBindSamplers_resolver::providers,
                      epoxy_glBindSamplers_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLBINDSAMPLERSPROC
epoxy_glBindSamplers_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_4,
        GL_extension_GL_ARB_multi_bind,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        1588 /* "glBindSamplers" */,
        1588 /* "glBindSamplers" */,
    };
    return gl_provider_resolver(entrypoint_strings + 1588 /* "glBindSamplers" */,
                                providers, entrypoints);
}